

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssa_rewrite_pass.cpp
# Opt level: O3

uint32_t __thiscall
spvtools::opt::SSARewriter::GetReplacement(SSARewriter *this,pair<unsigned_int,_unsigned_int> repl)

{
  uint32_t uVar1;
  _Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> _Var2;
  uint32_t val_id;
  uint32_t local_14;
  
  _Var2._M_cur = (__node_type *)
                 std::
                 _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 ::find(&(this->load_replacement_)._M_h,&local_14);
  local_14 = repl.second;
  if (_Var2._M_cur != (__node_type *)0x0) {
    do {
      uVar1 = *(uint32_t *)
               ((long)&((_Var2._M_cur)->
                       super__Hash_node_value<std::pair<const_unsigned_int,_unsigned_int>,_false>).
                       super__Hash_node_value_base<std::pair<const_unsigned_int,_unsigned_int>_>.
                       _M_storage._M_storage + 4);
      _Var2._M_cur = (__node_type *)
                     std::
                     _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     ::find(&(this->load_replacement_)._M_h,&local_14);
      local_14 = uVar1;
    } while (_Var2._M_cur != (__node_type *)0x0);
  }
  return local_14;
}

Assistant:

uint32_t SSARewriter::GetReplacement(std::pair<uint32_t, uint32_t> repl) {
  uint32_t val_id = repl.second;
  auto it = load_replacement_.find(val_id);
  while (it != load_replacement_.end()) {
    val_id = it->second;
    it = load_replacement_.find(val_id);
  }
  return val_id;
}